

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String __thiscall testing::internal::WideStringToUtf8(internal *this,wchar_t *str,int num_chars)

{
  size_t sVar1;
  size_t extraout_RDX;
  ulong uVar2;
  ulong uVar3;
  String SVar4;
  char buffer [32];
  stringstream stream;
  char acStack_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  if (num_chars == -1) {
    sVar1 = wcslen(str);
    num_chars = (int)sVar1;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar2 = 0;
  uVar3 = (ulong)(uint)num_chars;
  if (num_chars < 1) {
    uVar3 = uVar2;
  }
  for (; (uVar3 != uVar2 && (str[uVar2] != L'\0')); uVar2 = uVar2 + 1) {
    CodePointToUtf8(str[uVar2],acStack_1d8);
    std::operator<<(local_1a8,acStack_1d8);
  }
  StringStreamToString(this,(stringstream *)local_1b8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  SVar4.length_ = extraout_RDX;
  SVar4.c_str_ = (char *)this;
  return SVar4;
}

Assistant:

String WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1)
    num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    UInt32 unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point = CreateCodePointFromUtf16SurrogatePair(str[i],
                                                                 str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<UInt32>(str[i]);
    }

    char buffer[32];  // CodePointToUtf8 requires a buffer this big.
    stream << CodePointToUtf8(unicode_code_point, buffer);
  }
  return StringStreamToString(&stream);
}